

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

void __thiscall
pbrt::GeneralMedium<pbrt::CloudMediumProvider>::GeneralMedium
          (GeneralMedium<pbrt::CloudMediumProvider> *this,CloudMediumProvider *provider,
          SpectrumHandle *sigma_a,SpectrumHandle *sigma_s,Float sigScale,Float g,
          Transform *renderFromMedium,Allocator alloc)

{
  undefined8 uVar1;
  Bounds3f *pBVar2;
  DenselySampledSpectrum *in_RDX;
  CloudMediumProvider *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [64];
  float *in_R9;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined4 in_XMM0_Da;
  Float in_XMM1_Da;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff18;
  polymorphic_allocator<float> *in_stack_ffffffffffffff20;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  Transform *in_stack_ffffffffffffff30;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *other;
  Allocator alloc_00;
  Allocator alloc_01;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_70;
  float *local_48;
  memory_resource local_40;
  undefined1 (*local_38) [64];
  Float local_30;
  undefined4 local_2c;
  float *local_8;
  
  *in_RDI = in_RSI;
  local_38 = in_R8;
  local_30 = in_XMM1_Da;
  local_2c = in_XMM0_Da;
  local_8 = in_R9;
  pBVar2 = CloudMediumProvider::Bounds(in_RSI);
  in_RDI[3] = *(undefined8 *)&(pBVar2->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(pBVar2->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  in_RDI[1] = *(undefined8 *)&(pBVar2->pMin).super_Tuple3<pbrt::Point3,_float>;
  in_RDI[2] = uVar1;
  alloc_00.memoryResource = (memory_resource *)(in_RDI + 4);
  alloc_01.memoryResource = &local_40;
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_ffffffffffffff20,(SpectrumHandle *)in_stack_ffffffffffffff18
            );
  local_48 = local_8;
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_RDX,(SpectrumHandle *)in_stack_ffffffffffffff30,alloc_00);
  SpectrumHandle::SpectrumHandle
            ((SpectrumHandle *)in_stack_ffffffffffffff20,(SpectrumHandle *)in_stack_ffffffffffffff18
            );
  local_70.ptr = local_8;
  DenselySampledSpectrum::DenselySampledSpectrum
            (in_RDX,(SpectrumHandle *)in_stack_ffffffffffffff30,alloc_00);
  *(undefined4 *)(in_RDI + 0xe) = local_2c;
  HGPhaseFunction::HGPhaseFunction((HGPhaseFunction *)((long)in_RDI + 0x74),local_30);
  Inverse(in_stack_ffffffffffffff30);
  auVar3 = vmovdqu64_avx512f(*local_38);
  auVar4 = vmovdqu64_avx512f(local_38[1]);
  auVar4 = vmovdqu64_avx512f(auVar4);
  *(undefined1 (*) [64])(in_RDI + 0x27) = auVar4;
  auVar4 = vmovdqu64_avx512f(auVar3);
  *(undefined1 (*) [64])(in_RDI + 0x1f) = auVar4;
  other = &local_70;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x2f),
             &other->alloc);
  this_00 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x33);
  Point3<int>::Point3((Point3<int> *)0x7446bf);
  CloudMediumProvider::GetMaxDensityGrid
            ((CloudMediumProvider *)alloc_00.memoryResource,alloc_01,(Point3i *)in_RDX);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_RDX,other);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(this_00);
  return;
}

Assistant:

GeneralMedium(const DensityProvider *provider, SpectrumHandle sigma_a,
                  SpectrumHandle sigma_s, Float sigScale, Float g,
                  const Transform &renderFromMedium, Allocator alloc)
        : provider(provider),
          mediumBounds(provider->Bounds()),
          sigma_a_spec(sigma_a, alloc),
          sigma_s_spec(sigma_s, alloc),
          sigScale(sigScale),
          phase(g),
          mediumFromRender(Inverse(renderFromMedium)),
          renderFromMedium(renderFromMedium),
          maxDensityGrid(alloc) {
        maxDensityGrid = provider->GetMaxDensityGrid(alloc, &gridResolution);
    }